

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O1

bool __thiscall QString::endsWith(QString *this,QChar c,CaseSensitivity cs)

{
  long lVar1;
  short sVar2;
  char16_t cVar3;
  
  lVar1 = (this->d).size;
  if (lVar1 != 0) {
    cVar3 = (this->d).ptr[lVar1 + -1];
    if (cs != CaseSensitive) {
      sVar2 = (short)((uint)(int)(short)*(ushort *)
                                         (QUnicodeTables::uc_properties +
                                         (ulong)*(ushort *)
                                                 (QUnicodeTables::uc_property_trie +
                                                 (ulong)(((ushort)cVar3 & 0x1f) +
                                                        (uint)*(ushort *)
                                                               (QUnicodeTables::uc_property_trie +
                                                               (ulong)((ushort)cVar3 >> 5) * 2)) * 2
                                                 ) * 0x14 + 0xe) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)(((ushort)cVar3 & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie +
                                  (ulong)((ushort)cVar3 >> 5) * 2)) * 2) * 0x14 + 0xe) & 1) == 0) {
        cVar3 = sVar2 + cVar3;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar2 * 2) == 1) {
        cVar3 = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar2 * 2 + 2);
      }
      sVar2 = (short)((uint)(int)(short)*(ushort *)
                                         (QUnicodeTables::uc_properties +
                                         (ulong)*(ushort *)
                                                 (QUnicodeTables::uc_property_trie +
                                                 (ulong)(((ushort)c.ucs & 0x1f) +
                                                        (uint)*(ushort *)
                                                               (QUnicodeTables::uc_property_trie +
                                                               (ulong)((ushort)c.ucs >> 5) * 2)) * 2
                                                 ) * 0x14 + 0xe) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)(((ushort)c.ucs & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie +
                                  (ulong)((ushort)c.ucs >> 5) * 2)) * 2) * 0x14 + 0xe) & 1) == 0) {
        c.ucs = sVar2 + c.ucs;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar2 * 2) == 1) {
        c.ucs = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar2 * 2 + 2);
      }
    }
    return cVar3 == c.ucs;
  }
  return false;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }